

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O2

char * cargo_get_fprintl_args
                 (int argc,char **argv,int start,cargo_fprint_flags_t flags,size_t max_width,
                 size_t highlight_count,cargo_highlight_t *highlights_in)

{
  size_t sVar1;
  char *__s;
  size_t sVar2;
  void *__base;
  ulong uVar3;
  ulong uVar4;
  size_t sVar5;
  size_t sVar6;
  void *__s_00;
  long lVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  char *ptr;
  ulong uVar13;
  cargo_str_t str;
  
  if (highlights_in == (cargo_highlight_t *)0x0) {
    __assert_fail("highlights_in",
                  "/workspace/llm4binary/github/license_c_cmakelists/JoakimSoderberg[P]cargo/cargo.c"
                  ,0x12de,
                  "char *cargo_get_fprintl_args(int, char **, int, cargo_fprint_flags_t, size_t, size_t, const cargo_highlight_t *)"
                 );
  }
  sVar2 = _cargo_process_max_width(max_width);
  __base = _cargo_calloc(highlight_count,0x20);
  ptr = (char *)0x0;
  if (__base != (void *)0x0) {
    uVar3 = 0;
    if (0 < (int)highlight_count) {
      uVar3 = highlight_count & 0xffffffff;
    }
    for (; (char *)(uVar3 * 0x10) != ptr; ptr = ptr + 0x10) {
      *(undefined4 *)((long)__base + (long)ptr * 2) = *(undefined4 *)(ptr + (long)&highlights_in->i)
      ;
      *(undefined8 *)((long)__base + (long)ptr * 2 + 8) =
           *(undefined8 *)((long)&highlights_in->c + (long)ptr);
    }
    qsort(__base,highlight_count,0x20,_cargo_compare_highlights);
    uVar13 = 0;
    uVar4 = 0;
    if (0 < argc) {
      uVar4 = (ulong)(uint)argc;
    }
    lVar10 = (long)start;
    iVar11 = 0;
    lVar12 = 0;
    uVar9 = 0;
    for (; uVar4 != uVar13; uVar13 = uVar13 + 1) {
      if ((long)uVar13 < lVar10) {
        sVar5 = 0;
      }
      else {
        sVar5 = strlen(argv[uVar13]);
      }
      lVar8 = (long)iVar11;
      if (sVar2 <= lVar8 + sVar5) break;
      if (((int)uVar9 < (int)highlight_count) &&
         (lVar7 = (long)(int)uVar9 * 0x20, uVar13 == *(uint *)((long)__base + lVar7))) {
        if (lVar10 <= (long)uVar13) {
          *(undefined4 *)((long)__base + lVar7 + 0x1c) = 1;
        }
        *(int *)((long)__base + lVar7 + 0x18) = (int)sVar5;
        *(int *)((long)__base + lVar7 + 0x14) = iVar11;
        if (0 < (int)uVar9) {
          iVar11 = iVar11 - (*(int *)((long)__base + (ulong)uVar9 * 0x20 + -0xc) +
                            *(int *)((long)__base + (ulong)uVar9 * 0x20 + -8));
        }
        *(int *)((long)__base + lVar7 + 0x10) = iVar11;
        sVar6 = strlen(*(char **)((long)__base + lVar7 + 8));
        lVar12 = lVar12 + sVar6;
        uVar9 = uVar9 + 1;
      }
      iVar11 = (uint)(lVar10 <= (long)uVar13) + (int)(lVar8 + sVar5);
      lVar12 = lVar12 + iVar11;
    }
    sVar1 = lVar12 * 2 + 4;
    ptr = (char *)_cargo_malloc(sVar1);
    if (ptr == (char *)0x0) {
LAB_00109e16:
      _cargo_free(ptr);
      ptr = (char *)0x0;
    }
    else {
      str.offset = 0;
      str.s = ptr;
      str.l = sVar1;
      if ((flags & CARGO_FPRINT_NOARGS) == 0) {
        for (; sVar1 = str.offset, lVar10 < argc; lVar10 = lVar10 + 1) {
          __s = argv[lVar10];
          sVar5 = strlen(__s);
          if (sVar2 <= sVar5 + sVar1) break;
          cargo_appendf(&str,"%s ",__s);
        }
        cargo_appendf(&str,"\n");
      }
      if ((flags & CARGO_FPRINT_NOHIGHLIGHT) == 0) {
        for (lVar10 = 0; uVar3 << 5 != lVar10; lVar10 = lVar10 + 0x20) {
          sVar5 = strlen(*(char **)((long)__base + lVar10 + 8));
          sVar2 = (size_t)*(int *)((long)__base + lVar10 + 0x18);
          if (sVar2 != 0) {
            __s_00 = _cargo_malloc(sVar2);
            if (__s_00 == (void *)0x0) goto LAB_00109e16;
            memset(__s_00,(uint)**(byte **)((long)__base + lVar10 + 8),
                   (long)*(int *)((long)__base + lVar10 + 0x18));
            if (((flags & CARGO_FPRINT_NOCOLOR) == 0) && (1 < sVar5)) {
              if (*(int *)((long)__base + lVar10 + 0x1c) != 0) {
                cargo_appendf(&str,"%s",*(long *)((long)__base + lVar10 + 8) + 1);
              }
              uVar9 = *(uint *)((long)__base + lVar10 + 0x18);
              cargo_appendf(&str,"%*s%*.*s",(ulong)*(uint *)((long)__base + lVar10 + 0x10),"",
                            (ulong)uVar9,(ulong)uVar9,__s_00);
              if (*(int *)((long)__base + lVar10 + 0x1c) != 0) {
                cargo_appendf(&str,"%s","\x1b[0m");
              }
            }
            else {
              uVar9 = *(uint *)((long)__base + lVar10 + 0x18);
              cargo_appendf(&str,"%*s%*.*s",(ulong)*(uint *)((long)__base + lVar10 + 0x10),"",
                            (ulong)uVar9,(ulong)uVar9,__s_00);
            }
            _cargo_free(__s_00);
          }
        }
      }
    }
    _cargo_free(__base);
  }
  return ptr;
}

Assistant:

char *cargo_get_fprintl_args(int argc, char **argv, int start,
                            cargo_fprint_flags_t flags,
                            size_t max_width,
                            size_t highlight_count,
                            const cargo_highlight_t *highlights_in)
{
    char *ret = NULL;
    int i;
    int j;
    int global_indent = 0;
    size_t arglen = 0;
    cargo_str_t str;
    char *out = NULL;
    size_t out_size = 0;
    cargo_phighlight_t *highlights = NULL;
    assert(highlights_in);

    max_width = _cargo_process_max_width(max_width);

    if (!(highlights = _cargo_calloc(highlight_count, sizeof(cargo_phighlight_t))))
    {
        CARGODBG(1, "Out of memory!\n");
        return NULL;
    }

    for (i = 0; i < (int)highlight_count; i++)
    {
        highlights[i].i = highlights_in[i].i;
        highlights[i].c = highlights_in[i].c;
        CARGODBG(6, "  Highlight %d: %d\n", i, highlights[i].i);
    }

    CARGODBG(6, "  Sort highlights:\n");
    qsort(highlights, highlight_count,
        sizeof(cargo_phighlight_t), _cargo_compare_highlights);

    #if (CARGO_DEBUG >= 6)
    for (i = 0; i < (int)highlight_count; i++)
    {
        CARGODBG(6, "  Highlight %d: %d\n", i, highlights[i].i);
    }
    #endif

    // Get buffer size and highlight data.
    for (i = 0, j = 0; i < argc; i++)
    {
        arglen = (i >= start) ? strlen(argv[i]) : 0;

        if (arglen + global_indent >= max_width)
        {
            break;
        }

        if (j < (int)highlight_count)
        {
            cargo_phighlight_t *h = &highlights[j];
            if (h->i == i)
            {
                // We only keep this flag so that we can make sure we don't
                // output the color codes when an index is out of range.
                if (i >= start)
                {
                    h->show = 1;
                }

                h->highlight_len = (int)arglen;
                h->total_indent = global_indent;

                // We want to indent in relation to the previous indentation.
                if (j > 0)
                {
                    cargo_phighlight_t *hprev = &highlights[j - 1];
                    h->indent = h->total_indent
                              - (hprev->total_indent + hprev->highlight_len);
                }
                else
                {
                    h->indent = h->total_indent;
                }

                // If we use color, we must include the ANSI color code length
                // in the buffer length as well.
                out_size += strlen(h->c);

                j++;
            }
        }

        global_indent += arglen;
        if (i >= start) global_indent++; // + 1 for space.
        out_size += global_indent;
    }

    // Allocate and fill buffer.
    out_size += 2; // New lines.
    out_size *= 2; // Two rows, one for args and one for highlighting.

    if (!(out = _cargo_malloc(out_size)))
    {
        CARGODBG(1, "Out of memory!\n");
        goto fail;
    }

    str.s = out;
    str.l = out_size;
    str.offset = 0;

    // TODO: Try adding an "..." and try to fit all highlights on screen if possible.
    if (!(flags & CARGO_FPRINT_NOARGS))
    {
        for (i = start; i < argc; i++)
        {
            // The highlight will be incorrect if we allow a line break.
            if (str.offset + strlen(argv[i]) >= max_width)
            {
                break;
            }

            cargo_appendf(&str, "%s ", argv[i]);
        }

        cargo_appendf(&str, "\n");
    }

    if (!(flags & CARGO_FPRINT_NOHIGHLIGHT))
    {
        for (i = 0; i < (int)highlight_count; i++)
        {
            cargo_phighlight_t *h = &highlights[i];
            char *highlvec;
            int has_color = strlen(h->c) > 1;

            if (h->highlight_len == 0)
                continue;

            if (!(highlvec = _cargo_malloc(h->highlight_len)))
            {
                CARGODBG(1, "Out of memory!\n");
                goto fail;
            }

            // Use the first character as the highlight character.
            //                                ~~~~~~~~~
            memset(highlvec, *h->c, h->highlight_len);

            // If we have more characters, we append that as a string.
            // (This can be used for color ansi color codes).
            if (!(flags & CARGO_FPRINT_NOCOLOR) && has_color && h->show)
            {
                cargo_appendf(&str, "%s", &h->c[1]);
            }

            cargo_appendf(&str, "%*s%*.*s",
                h->indent, "",
                h->highlight_len,
                h->highlight_len,
                highlvec);

            if (!(flags & CARGO_FPRINT_NOCOLOR) && has_color && h->show)
            {
                cargo_appendf(&str, "%s", CARGO_COLOR_RESET);
            }

            _cargo_free(highlvec);
        }
    }

    ret = out;

fail:
    if (!ret) _cargo_free(out);
    _cargo_free(highlights);

    return ret;
}